

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O1

void __thiscall
osc::OutboundPacketStream::OutboundPacketStream
          (OutboundPacketStream *this,char *buffer,size_t capacity)

{
  this->data_ = buffer;
  this->end_ = buffer + capacity;
  this->typeTagsCurrent_ = buffer + capacity;
  this->messageCursor_ = buffer;
  this->argumentCurrent_ = buffer;
  this->elementSizePtr_ = (uint32 *)0x0;
  this->messageIsInProgress_ = false;
  return;
}

Assistant:

OutboundPacketStream::OutboundPacketStream( char *buffer, std::size_t capacity )
    : data_( buffer )
    , end_( data_ + capacity )
    , typeTagsCurrent_( end_ )
    , messageCursor_( data_ )
    , argumentCurrent_( data_ )
    , elementSizePtr_( 0 )
    , messageIsInProgress_( false )
{
    // sanity check integer types declared in OscTypes.h 
    // you'll need to fix OscTypes.h if any of these asserts fail
    assert( sizeof(osc::int32) == 4 );
    assert( sizeof(osc::uint32) == 4 );
    assert( sizeof(osc::int64) == 8 );
    assert( sizeof(osc::uint64) == 8 );
}